

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_script.cpp
# Opt level: O3

UniValue *
DeriveAddresses(UniValue *__return_storage_ptr__,Descriptor *desc,int64_t range_begin,
               int64_t range_end,FlatSigningProvider *key_provider)

{
  UniValue val;
  bool bVar1;
  int iVar2;
  UniValue *pUVar3;
  CScript *scriptPubKey;
  long in_FS_OFFSET;
  vector<CScript,_std::allocator<CScript>_> scripts;
  CTxDestination dest;
  FlatSigningProvider provider;
  undefined **ppuVar4;
  ulong uVar5;
  CScript *pCVar6;
  CScript *pCVar7;
  CScript *pCVar8;
  pointer pCVar9;
  undefined8 in_stack_fffffffffffffde0;
  _Alloc_hider in_stack_fffffffffffffde8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f8;
  vector<UniValue,_std::allocator<UniValue>_> local_1e0;
  string local_1c8;
  undefined1 local_1a8 [72];
  __index_type local_160;
  undefined1 local_150 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_128;
  undefined8 local_120;
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
  local_118;
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
  local_e8;
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
  local_b8;
  _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
  local_88;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48;
  undefined8 local_47;
  undefined4 local_3f;
  undefined2 local_3b;
  char local_39;
  UniValue *local_38;
  
  local_38 = *(UniValue **)(in_FS_OFFSET + 0x28);
  local_58 = &local_48;
  __return_storage_ptr__->typ = VARR;
  (__return_storage_ptr__->val)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->val).field_2;
  (__return_storage_ptr__->val).field_2._M_local_buf[0] = '\0';
  *(undefined8 *)((long)&(__return_storage_ptr__->val).field_2 + 1) = local_47;
  *(undefined4 *)((long)&(__return_storage_ptr__->val).field_2 + 9) = local_3f;
  *(undefined2 *)((long)&(__return_storage_ptr__->val).field_2 + 0xd) = local_3b;
  (__return_storage_ptr__->val).field_2._M_local_buf[0xf] = local_39;
  (__return_storage_ptr__->val)._M_string_length = 0;
  local_50 = 0;
  local_48 = 0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (range_begin <= range_end) {
    ppuVar4 = &PTR__FlatSigningProvider_013beda8;
    do {
      local_140._M_allocated_capacity._0_4_ = 0;
      local_140._8_8_ = 0;
      local_130 = &local_140;
      local_120 = 0;
      local_118._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_118._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_118._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_118._M_impl.super__Rb_tree_header._M_header;
      local_118._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_e8._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_e8._M_impl.super__Rb_tree_header._M_header;
      local_e8._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_b8._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_b8._M_impl.super__Rb_tree_header._M_header;
      local_b8._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_88._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_88._M_impl.super__Rb_tree_header._M_header;
      local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
      pCVar9 = (pointer)0x0;
      scriptPubKey = (CScript *)0x0;
      pCVar7 = (CScript *)0x0;
      local_150._0_8_ = ppuVar4;
      local_128 = local_130;
      local_118._M_impl.super__Rb_tree_header._M_header._M_right =
           local_118._M_impl.super__Rb_tree_header._M_header._M_left;
      local_e8._M_impl.super__Rb_tree_header._M_header._M_right =
           local_e8._M_impl.super__Rb_tree_header._M_header._M_left;
      local_b8._M_impl.super__Rb_tree_header._M_header._M_right =
           local_b8._M_impl.super__Rb_tree_header._M_header._M_left;
      local_88._M_impl.super__Rb_tree_header._M_header._M_right =
           local_88._M_impl.super__Rb_tree_header._M_header._M_left;
      iVar2 = (*desc->_vptr_Descriptor[8])
                        (desc,range_begin & 0xffffffff,key_provider,&stack0xfffffffffffffdc8,
                         local_150,0);
      uVar5 = range_begin;
      pCVar6 = scriptPubKey;
      pCVar8 = pCVar7;
      if ((char)iVar2 == '\0') {
        pUVar3 = (UniValue *)__cxa_allocate_exception(0x58);
        local_1a8._0_8_ = local_1a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"Cannot derive script without private keys","");
        JSONRPCError(pUVar3,-5,(string *)local_1a8);
        if (*(UniValue **)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pUVar3,&UniValue::typeinfo,UniValue::~UniValue);
        }
        goto LAB_00a6dd4b;
      }
      for (; scriptPubKey != pCVar7; scriptPubKey = scriptPubKey + 1) {
        local_1a8._16_8_ = 0;
        local_1a8._24_8_ = 0;
        local_1a8._0_8_ = (undefined1 *)0x0;
        local_1a8._8_8_ = 0;
        local_160 = '\0';
        bVar1 = ExtractDestination(scriptPubKey,(CTxDestination *)local_1a8);
        if (bVar1) {
          EncodeDestination_abi_cxx11_(&local_1c8,(CTxDestination *)local_1a8);
          UniValue::
          UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ((UniValue *)&stack0xfffffffffffffde0,&local_1c8);
          val.val._M_dataplus._M_p = (pointer)range_end;
          val._0_8_ = __return_storage_ptr__;
          val.val._M_string_length = (size_type)ppuVar4;
          val.val.field_2._M_allocated_capacity = (size_type)desc;
          val.val.field_2._8_8_ = key_provider;
          val.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)uVar5;
          val.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)pCVar6;
          val.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pCVar8;
          val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)pCVar9;
          val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffde0;
          val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffde8._M_p;
          UniValue::push_back(__return_storage_ptr__,val);
          std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_1e0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_1f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)in_stack_fffffffffffffde8._M_p != &local_208) {
            operator_delete(in_stack_fffffffffffffde8._M_p,local_208._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
          }
        }
        else if (((ulong)((long)pCVar8 - (long)pCVar6) < 0x21) || (local_160 != '\x01')) {
          pUVar3 = (UniValue *)__cxa_allocate_exception(0x58);
          local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1c8,"Descriptor does not have a corresponding address","");
          JSONRPCError(pUVar3,-5,&local_1c8);
          if (*(UniValue **)(in_FS_OFFSET + 0x28) == local_38) {
            __cxa_throw(pUVar3,&UniValue::typeinfo,UniValue::~UniValue);
          }
          goto LAB_00a6dd4b;
        }
        std::__detail::__variant::
        _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                             *)local_1a8);
      }
      std::vector<CScript,_std::allocator<CScript>_>::~vector
                ((vector<CScript,_std::allocator<CScript>_> *)&stack0xfffffffffffffdc8);
      std::
      _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
      ::~_Rb_tree(&local_88);
      std::
      _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
      ::~_Rb_tree(&local_b8);
      std::
      _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
      ::~_Rb_tree(&local_e8);
      std::
      _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
      ::~_Rb_tree(&local_118);
      std::
      _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
      ::~_Rb_tree((_Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
                   *)(local_150 + 8));
      range_begin = uVar5 + 1;
    } while (uVar5 != range_end);
    if ((__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      if (*(UniValue **)(in_FS_OFFSET + 0x28) == local_38) {
        return *(UniValue **)(in_FS_OFFSET + 0x28);
      }
      goto LAB_00a6dd4b;
    }
  }
  pUVar3 = (UniValue *)__cxa_allocate_exception(0x58);
  local_150._0_8_ = &local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"Unexpected empty result","");
  JSONRPCError(pUVar3,-1,(string *)local_150);
  if (*(UniValue **)(in_FS_OFFSET + 0x28) == local_38) {
    __cxa_throw(pUVar3,&UniValue::typeinfo,UniValue::~UniValue);
  }
LAB_00a6dd4b:
  __stack_chk_fail();
}

Assistant:

static UniValue DeriveAddresses(const Descriptor* desc, int64_t range_begin, int64_t range_end, FlatSigningProvider& key_provider)
{
    UniValue addresses(UniValue::VARR);

    for (int64_t i = range_begin; i <= range_end; ++i) {
        FlatSigningProvider provider;
        std::vector<CScript> scripts;
        if (!desc->Expand(i, key_provider, scripts, provider)) {
            throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Cannot derive script without private keys");
        }

        for (const CScript& script : scripts) {
            CTxDestination dest;
            if (!ExtractDestination(script, dest)) {
                // ExtractDestination no longer returns true for P2PK since it doesn't have a corresponding address
                // However combo will output P2PK and should just ignore that script
                if (scripts.size() > 1 && std::get_if<PubKeyDestination>(&dest)) {
                    continue;
                }
                throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Descriptor does not have a corresponding address");
            }

            addresses.push_back(EncodeDestination(dest));
        }
    }

    // This should not be possible, but an assert seems overkill:
    if (addresses.empty()) {
        throw JSONRPCError(RPC_MISC_ERROR, "Unexpected empty result");
    }

    return addresses;
}